

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O1

void irr::executeBlit_TextureBlend_16_to_16(SBlitJob *job)

{
  ushort uVar1;
  u32 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  short sVar7;
  u32 uVar8;
  int iVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  
  fVar13 = floorf((float)job->x_stretch * 262144.0 + 0.0);
  fVar14 = floorf((float)job->y_stretch * 262144.0 + 0.0);
  uVar2 = job->height;
  if (uVar2 != 0) {
    pvVar6 = job->src;
    pvVar10 = job->dst;
    iVar3 = job->srcPitch;
    uVar4 = job->width;
    uVar5 = job->dstPitch;
    iVar11 = 0;
    uVar8 = 0;
    do {
      if ((ulong)uVar4 != 0) {
        uVar12 = 0;
        iVar9 = 0;
        do {
          uVar1 = *(ushort *)
                   ((long)pvVar6 + (long)(iVar9 >> 0x12) * 2 + (long)(iVar11 >> 0x12) * (long)iVar3)
          ;
          sVar7 = (short)uVar1 >> 0xf;
          *(ushort *)((long)pvVar10 + uVar12 * 2) =
               sVar7 + 0x8000U & uVar1 | 0x7fffU - sVar7 & *(ushort *)((long)pvVar10 + uVar12 * 2);
          uVar12 = uVar12 + 1;
          iVar9 = iVar9 + (int)fVar13;
        } while (uVar4 != uVar12);
      }
      pvVar10 = (void *)((long)pvVar10 + (ulong)uVar5);
      uVar8 = uVar8 + 1;
      iVar11 = iVar11 + (int)fVar14;
    } while (uVar8 != uVar2);
  }
  return;
}

Assistant:

static void executeBlit_TextureBlend_16_to_16(const SBlitJob *job)
{
	const f18 wscale = f32_to_f18(job->x_stretch);
	const f18 hscale = f32_to_f18(job->y_stretch);

	f18 src_y = f18_zero;
	u16 *dst = (u16 *)job->dst;

	for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
		const u16 *src = (u16 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));
		f18 src_x = f18_zero;
		for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
			dst[dx] = PixelBlend16(dst[dx], src[f18_floor(src_x)]);
		}
		dst = (u16 *)((u8 *)(dst) + job->dstPitch);
	}
}